

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O0

void sigmund_free(t_sigmund *x)

{
  t_sigmund *x_local;
  
  if (x->x_inbuf != (t_sample *)0x0) {
    freebytes(x->x_inbuf,(long)x->x_npts << 2);
  }
  if (x->x_trackv != (t_peak_conflict *)0x0) {
    freebytes(x->x_trackv,(long)x->x_ntrack << 5);
  }
  freebytes(x->x_varoutv,(long)x->x_nvarout << 4);
  clock_free(x->x_clock);
  return;
}

Assistant:

static void sigmund_free(t_sigmund *x)
{
    if (x->x_inbuf)
    {
        freebytes(x->x_inbuf, x->x_npts * sizeof(*x->x_inbuf));
#ifdef MSP
        freebytes(x->x_inbuf2, x->x_npts * sizeof(*x->x_inbuf2));
#endif
    }
    if (x->x_trackv)
        freebytes(x->x_trackv, x->x_ntrack * sizeof(*x->x_trackv));
    freebytes(x->x_varoutv, x->x_nvarout * sizeof(t_varout));
    clock_free(x->x_clock);
}